

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::IsTrue
          (cmConditionEvaluator *this,
          vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *args,
          string *errorString,MessageType *status)

{
  __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  __first;
  __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  __last;
  bool bVar1;
  MessageType *pMVar2;
  string *extraout_RDX;
  allocator_type local_39;
  cmArgumentList newArgs;
  
  errorString->_M_string_length = 0;
  *(errorString->_M_dataplus)._M_p = '\0';
  __first._M_current =
       (args->
       super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (args->
       super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current == __last._M_current) {
    return false;
  }
  std::__cxx11::list<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
  list<__gnu_cxx::__normal_iterator<cmExpandedCommandArgument_const*,std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>>,void>
            ((list<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)&newArgs,
             __first,__last,&local_39);
  pMVar2 = status;
  bVar1 = HandleLevel0(this,&newArgs,errorString,status);
  if (bVar1) {
    HandleLevel1(this,&newArgs,extraout_RDX,pMVar2);
    bVar1 = HandleLevel2(this,&newArgs,errorString,status);
    if (bVar1) {
      HandleLevel3(this,&newArgs,errorString,status);
      HandleLevel4(this,&newArgs,errorString,status);
      if (newArgs.
          super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
          _M_impl._M_node._M_size == 1) {
        bVar1 = GetBooleanValueWithAutoDereference
                          (this,(cmExpandedCommandArgument *)
                                (newArgs.
                                 super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                                 ._M_impl._M_node.super__List_node_base._M_next + 1),errorString,
                           status,true);
        goto LAB_002fbbb3;
      }
      std::__cxx11::string::assign((char *)errorString);
      *status = FATAL_ERROR;
    }
  }
  bVar1 = false;
LAB_002fbbb3:
  std::__cxx11::_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
  _M_clear(&newArgs.
            super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>)
  ;
  return bVar1;
}

Assistant:

bool cmConditionEvaluator::IsTrue(
  const std::vector<cmExpandedCommandArgument>& args, std::string& errorString,
  MessageType& status)
{
  errorString.clear();

  // handle empty invocation
  if (args.empty()) {
    return false;
  }

  // store the reduced args in this vector
  cmArgumentList newArgs(args.begin(), args.end());

  // now loop through the arguments and see if we can reduce any of them
  // we do this multiple times. Once for each level of precedence
  // parens
  if (!this->HandleLevel0(newArgs, errorString, status)) {
    return false;
  }
  // predicates
  if (!this->HandleLevel1(newArgs, errorString, status)) {
    return false;
  }
  // binary ops
  if (!this->HandleLevel2(newArgs, errorString, status)) {
    return false;
  }

  // NOT
  if (!this->HandleLevel3(newArgs, errorString, status)) {
    return false;
  }
  // AND OR
  if (!this->HandleLevel4(newArgs, errorString, status)) {
    return false;
  }

  // now at the end there should only be one argument left
  if (newArgs.size() != 1) {
    errorString = "Unknown arguments specified";
    status = MessageType::FATAL_ERROR;
    return false;
  }

  return this->GetBooleanValueWithAutoDereference(newArgs.front(), errorString,
                                                  status, true);
}